

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::tryExpand
          (DataLocationUsage *this,Group *group,DataLocation *location,uint oldLgSize,uint oldOffset
          ,uint expansionFactor)

{
  bool bVar1;
  
  if (oldOffset == 0) {
    if (this->lgSizeUsed == oldLgSize) {
      bVar1 = tryExpandUsage(this,group,location,expansionFactor + oldLgSize,false);
      return bVar1;
    }
    oldOffset = 0;
  }
  bVar1 = HoleSet<unsigned_char>::tryExpand(&this->holes,(uchar)oldLgSize,oldOffset,expansionFactor)
  ;
  return bVar1;
}

Assistant:

bool tryExpand(Group& group, Union::DataLocation& location,
                     uint oldLgSize, uint oldOffset, uint expansionFactor) {
        if (oldOffset == 0 && lgSizeUsed == oldLgSize) {
          // This location contains exactly the requested data, so just expand the whole thing.
          return tryExpandUsage(group, location, oldLgSize + expansionFactor, false);
        } else {
          // This location contains the requested data plus other stuff.  Therefore the data cannot
          // possibly expand past the end of the space we've already marked used without either
          // overlapping with something else or breaking alignment rules.  We only have to combine
          // it with holes.
          return holes.tryExpand(oldLgSize, oldOffset, expansionFactor);
        }
      }